

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  object *this_00;
  PyObject *pPVar1;
  error_scope scope;
  gil_scoped_acquire gil;
  error_scope eStack_38;
  gil_scoped_acquire local_20;
  
  *(undefined ***)this = &PTR__error_already_set_00133ae0;
  this_00 = &this->type;
  if ((this->type).super_handle.m_ptr != (PyObject *)0x0) {
    PyErr_Fetch(&eStack_38,&eStack_38.value,&eStack_38.trace);
    gil_scoped_acquire::gil_scoped_acquire(&local_20);
    pPVar1 = (this_00->super_handle).m_ptr;
    (this_00->super_handle).m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    pPVar1 = (this->value).super_handle.m_ptr;
    (this->value).super_handle.m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    pPVar1 = (this->trace).super_handle.m_ptr;
    (this->trace).super_handle.m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    gil_scoped_acquire::~gil_scoped_acquire(&local_20);
    error_scope::~error_scope(&eStack_38);
  }
  object::~object(&this->trace);
  object::~object(&this->value);
  object::~object(this_00);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (type) {
        error_scope scope;
        gil_scoped_acquire gil;
        type.release().dec_ref();
        value.release().dec_ref();
        trace.release().dec_ref();
    }
}